

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void llb_buildsystem_command_interface_task_needs_input
               (llb_task_interface_t ti,llb_build_key_t *key,uintptr_t inputID)

{
  long *local_50 [2];
  long local_40 [2];
  TaskInterface local_30;
  
  local_30.ctx = ti.ctx;
  local_30.impl = ti.impl;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)(key + 0x10),*(long *)(key + 0x18) + *(long *)(key + 0x10))
  ;
  llbuild::core::TaskInterface::request(&local_30,(KeyType *)local_50,inputID);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void llb_buildsystem_command_interface_task_needs_input(llb_task_interface_t ti, llb_build_key_t* key, uintptr_t inputID) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  coreti->request(((CAPIBuildKey *)key)->getInternalBuildKey().toData(), inputID);
}